

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

exr_result_t dispatch_write(exr_context_t ctxt,void *buf,uint64_t sz,uint64_t *offsetp)

{
  exr_result_t eVar1;
  uint64_t uVar2;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if (offsetp == (uint64_t *)0x0) {
      eVar1 = (*ctxt->report_error)(ctxt,3,"write requested with no output offset pointer");
      return eVar1;
    }
    if (ctxt->write_fn == (exr_write_func_ptr_t)0x0) {
      eVar1 = (*ctxt->standard_error)(ctxt,8);
      return eVar1;
    }
    uVar2 = (*ctxt->write_fn)(ctxt,ctxt->user_data,buf,sz,*offsetp,ctxt->print_error);
    if (0 < (long)uVar2) {
      *offsetp = *offsetp + uVar2;
    }
    eVar1 = 0xb;
    if (uVar2 == sz) {
      eVar1 = 0;
    }
  }
  return eVar1;
}

Assistant:

static exr_result_t
dispatch_write (
    exr_context_t ctxt, const void* buf, uint64_t sz, uint64_t* offsetp)
{
    int64_t rval = -1;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!offsetp)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "write requested with no output offset pointer");

    if (ctxt->write_fn)
        rval = ctxt->write_fn (
            ctxt, ctxt->user_data, buf, sz, *offsetp, ctxt->print_error);
    else
        return ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE);

    if (rval > 0) *offsetp += (uint64_t) rval;

    return (rval == (int64_t) sz) ? EXR_ERR_SUCCESS : EXR_ERR_WRITE_IO;
}